

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O0

string * __thiscall
Type1Input::GetGlyphCharStringName_abi_cxx11_
          (string *__return_storage_ptr__,Type1Input *this,Byte inCharStringIndex)

{
  long lVar1;
  char *__s;
  allocator<char> local_2e;
  StandardEncoding local_2d [8];
  StandardEncoding standardEncoding;
  allocator<char> local_1a;
  byte local_19;
  Type1Input *pTStack_18;
  Byte inCharStringIndex_local;
  Type1Input *this_local;
  
  local_19 = inCharStringIndex;
  pTStack_18 = this;
  this_local = (Type1Input *)__return_storage_ptr__;
  if ((this->mEncoding).EncodingType == eType1EncodingTypeCustom) {
    lVar1 = std::__cxx11::string::size();
    if (lVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,".notdef",&local_1a);
      std::allocator<char>::~allocator(&local_1a);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)((this->mEncoding).mCustomEncoding + local_19));
    }
  }
  else {
    StandardEncoding::StandardEncoding(local_2d);
    __s = StandardEncoding::GetEncodedGlyphName(local_2d,local_19);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    StandardEncoding::~StandardEncoding(local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Type1Input::GetGlyphCharStringName(Byte inCharStringIndex)
{
	if(eType1EncodingTypeCustom == mEncoding.EncodingType)
	{
		if(mEncoding.mCustomEncoding[inCharStringIndex].size() == 0)
			return ".notdef";
		else
			return mEncoding.mCustomEncoding[inCharStringIndex];
	}
	else
	{
		StandardEncoding standardEncoding;

		return standardEncoding.GetEncodedGlyphName(inCharStringIndex);
	}
}